

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpen.c
# Opt level: O1

fillpen_t *
fillpen_init(dict_t *dict,char *file,float64 silprob,float64 fillprob,float64 lw,float64 wip,
            logmath_t *logmath)

{
  int32 iVar1;
  int32 iVar2;
  s3wid_t sVar3;
  fillpen_t *pfVar4;
  int32 *piVar5;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  s3wid_t *psVar8;
  int iVar9;
  long lVar10;
  float64 prob;
  char line [1024];
  char wd [1024];
  float64 local_848;
  FILE *local_840;
  char local_838 [1024];
  char local_438 [1032];
  
  pfVar4 = (fillpen_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                          ,0x5c);
  pfVar4->dict = dict;
  pfVar4->lw = lw;
  pfVar4->wip = wip;
  pfVar4->silprob = silprob;
  pfVar4->fillerprob = fillprob;
  if (dict->filler_end < dict->filler_start) {
    piVar5 = (int32 *)0x0;
  }
  else {
    piVar5 = (int32 *)__ckd_calloc__((long)((dict->filler_end - dict->filler_start) + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                                     ,0x66);
  }
  pfVar4->prob = piVar5;
  iVar9 = dict->filler_start;
  lVar10 = (long)iVar9;
  local_848 = fillprob;
  if (iVar9 <= dict->filler_end) {
    iVar9 = iVar9 + -1;
    do {
      iVar1 = logs3(logmath,local_848);
      iVar2 = logs3(logmath,wip);
      pfVar4->prob[lVar10 - dict->filler_start] = (int)((double)iVar1 * (double)lw + (double)iVar2);
      iVar9 = iVar9 + 1;
      lVar10 = lVar10 + 1;
    } while (iVar9 < dict->filler_end);
  }
  sVar3 = dict_wordid(dict,"<sil>");
  if (((-1 < sVar3) && (dict->filler_start <= sVar3)) && (sVar3 <= dict->filler_end)) {
    local_848 = silprob;
    iVar1 = logs3(logmath,silprob);
    iVar2 = logs3(logmath,wip);
    pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
         (int)((double)iVar1 * (double)lw + (double)iVar2);
    if (file != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
              ,0x7d,"Reading filler penalty file: %s\n",file);
      __stream = fopen(file,"r");
      if (__stream == (FILE *)0x0) {
        pcVar6 = "fopen(%s,r) failed\n";
        lVar10 = 0x7f;
        goto LAB_0010e171;
      }
      pcVar6 = fgets(local_838,0x400,__stream);
      if (pcVar6 != (char *)0x0) {
        local_840 = __stream;
        do {
          if (local_838[0] != '#') {
            uVar7 = __isoc99_sscanf(local_838,"%s %lf",local_438,&local_848);
            if ((uVar7 & 0xfffffffd) != 0) {
              pcVar6 = "Bad input line: %s\n";
              file = local_838;
              lVar10 = 0x86;
              goto LAB_0010e171;
            }
            sVar3 = dict_wordid(dict,local_438);
            if (((sVar3 < 0) || (sVar3 < dict->filler_start)) || (dict->filler_end < sVar3)) {
              pcVar6 = "%s not a filler word in the given dictionary\n";
              file = "<sil>";
              lVar10 = 0x8b;
              goto LAB_0010e171;
            }
            iVar1 = logs3(logmath,local_848);
            iVar2 = logs3(logmath,wip);
            pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
                 (int)((double)iVar1 * (double)lw + (double)iVar2);
            __stream = local_840;
          }
          pcVar6 = fgets(local_838,0x400,__stream);
        } while (pcVar6 != (char *)0x0);
      }
      fclose(__stream);
      iVar9 = dict->filler_start;
      if (iVar9 <= dict->filler_end) {
        lVar10 = (long)iVar9 + -1;
        psVar8 = &dict->word[iVar9].basewid;
        do {
          if (iVar9 != *psVar8) {
            pfVar4->prob[(lVar10 + 1) - (long)dict->filler_start] =
                 pfVar4->prob[(long)*psVar8 - (long)dict->filler_start];
          }
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + 1;
          psVar8 = psVar8 + 8;
        } while (lVar10 < dict->filler_end);
      }
    }
    return pfVar4;
  }
  pcVar6 = "%s not a filler word in the given dictionary\n";
  file = "<sil>";
  lVar10 = 0x74;
LAB_0010e171:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
          ,lVar10,pcVar6,file);
  exit(1);
}

Assistant:

fillpen_t *
fillpen_init(dict_t * dict, const char *file, float64 silprob, float64 fillprob,
             float64 lw, float64 wip, logmath_t *logmath)
{
    s3wid_t w, bw;
    float64 prob;
    FILE *fp;
    char line[1024], wd[1024];
    int32 k;
    fillpen_t *_fillpen;

    _fillpen = (fillpen_t *) ckd_calloc(1, sizeof(fillpen_t));

    _fillpen->dict = dict;
    _fillpen->lw = lw;
    _fillpen->wip = wip;
    _fillpen->silprob = silprob;
    _fillpen->fillerprob = fillprob;
    if (dict->filler_end >= dict->filler_start)
        _fillpen->prob =
            (int32 *) ckd_calloc(dict->filler_end - dict->filler_start + 1,
                                 sizeof(int32));
    else
        _fillpen->prob = NULL;

    /* Initialize all words with filler penalty (HACK!! backward compatibility) */
    prob = fillprob;
    for (w = dict->filler_start; w <= dict->filler_end; w++)
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite silence penalty (HACK!! backward compatibility) */
    w = dict_wordid(dict, S3_SILENCE_WORD);
    if (NOT_S3WID(w) || (w < dict->filler_start) || (w > dict->filler_end))
        E_FATAL("%s not a filler word in the given dictionary\n",
                S3_SILENCE_WORD);
    prob = silprob;
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite with filler prob input file, if specified */
    if (!file)
        return _fillpen;

    E_INFO("Reading filler penalty file: %s\n", file);
    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL("fopen(%s,r) failed\n", file);
    while (fgets(line, sizeof(line), fp) != NULL) {
        if (line[0] == '#')     /* Skip comment lines */
            continue;

        k = sscanf(line, "%s %lf", wd, &prob);
        if ((k != 0) && (k != 2))
            E_FATAL("Bad input line: %s\n", line);
        w = dict_wordid(dict, wd);
        if (NOT_S3WID(w) || (w < dict->filler_start)
            || (w > dict->filler_end))
            E_FATAL("%s not a filler word in the given dictionary\n",
                    S3_SILENCE_WORD);

        _fillpen->prob[w - dict->filler_start] =
            (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));
    }
    fclose(fp);

    /* Replicate fillpen values for alternative pronunciations */
    for (w = dict->filler_start; w <= dict->filler_end; w++) {
        bw = dict_basewid(dict, w);
        if (bw != w)
            _fillpen->prob[w - dict->filler_start] =
                _fillpen->prob[bw - dict->filler_start];
    }

    return _fillpen;
}